

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

int skipIfBlock(bool toEndc)

{
  bool bVar1;
  LexerState *pLVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  IfStack *pIVar6;
  char *fmt;
  int iVar7;
  byte bVar8;
  int unaff_R14D;
  
  pLVar2 = lexerState;
  lexerState->mode = LEXER_NORMAL;
  pIVar6 = (IfStack *)&pLVar2->ifStack;
  iVar7 = 0;
  do {
    pIVar6 = pIVar6->next;
    iVar7 = iVar7 + 1;
  } while (pIVar6 != (IfStack *)0x0);
  bVar8 = pLVar2->atLineStart;
  pLVar2->disableMacroArgs = true;
  pLVar2->disableInterpolation = true;
  do {
    if ((bVar8 & 1) == 0) goto LAB_0010f657;
    while ((uVar3 = peek(), uVar3 == 0x20 || (uVar3 == 9))) {
      shiftChar();
    }
    if ((0x19 < (uVar3 & 0xffffffdf) - 0x41) && ((uVar3 != 0x5f && (uVar3 != 0x2e))))
    goto switchD_0010f5d3_default;
    shiftChar();
    unaff_R14D = readIdentifier((char)uVar3);
    switch(unaff_R14D) {
    case 0x5d:
      lexer_IncIFDepth();
      unaff_R14D = 0x5d;
    default:
switchD_0010f5d3_default:
      bVar1 = true;
      bVar8 = 0;
      break;
    case 0x5e:
      if (lexerState->ifStack->reachedElseBlock == true) {
        fmt = "Found ELIF after an ELSE block\n";
LAB_0010f70f:
        fatalerror(fmt);
      }
      goto LAB_0010f611;
    case 0x5f:
      if (lexerState->ifStack->reachedElseBlock == true) {
        fmt = "Found ELSE after an ELSE block\n";
        goto LAB_0010f70f;
      }
      lexerState->ifStack->reachedElseBlock = true;
LAB_0010f611:
      if (toEndc) goto switchD_0010f5d3_default;
switchD_0010f5d3_caseD_60:
      pIVar6 = (IfStack *)&lexerState->ifStack;
      iVar4 = iVar7;
      do {
        pIVar6 = pIVar6->next;
        iVar4 = iVar4 + -1;
      } while (pIVar6 != (IfStack *)0x0);
      if (iVar4 != 0) {
        if (unaff_R14D == 0x60) {
          lexer_DecIFDepth();
          unaff_R14D = 0x60;
        }
        goto switchD_0010f5d3_default;
      }
      bVar1 = false;
      break;
    case 0x60:
      goto switchD_0010f5d3_caseD_60;
    }
    if (!bVar1) {
LAB_0010f6d9:
      pLVar2 = lexerState;
      pLVar2->disableMacroArgs = false;
      pLVar2->disableInterpolation = false;
      pLVar2->atLineStart = false;
      return unaff_R14D;
    }
LAB_0010f657:
    do {
      iVar4 = peek();
      if (iVar4 == -1) {
        unaff_R14D = 0;
      }
      else {
        shiftChar();
        iVar5 = iVar4;
        if ((iVar4 == 10) || (iVar4 == 0xd)) {
          bVar8 = 1;
        }
        else if ((iVar4 == 0x5c) && (iVar5 = peek(), iVar5 != -1)) {
          shiftChar();
        }
        if (iVar5 != 10) {
          if (iVar5 != 0xd) goto LAB_0010f6c2;
          iVar5 = peek();
          if (iVar5 == 10) {
            shiftChar();
          }
        }
        pLVar2 = lexerState;
        lexerState->lineNo = lexerState->lineNo + 1;
        pLVar2->colNo = 1;
      }
LAB_0010f6c2:
      if (iVar4 == -1) goto LAB_0010f6d9;
    } while ((bVar8 & 1) == 0);
  } while( true );
}

Assistant:

static int skipIfBlock(bool toEndc)
{
	lexer_SetMode(LEXER_NORMAL);
	uint32_t startingDepth = lexer_GetIFDepth();
	int token;
	bool atLineStart = lexerState->atLineStart;

	// Prevent expanding macro args and symbol interpolation in this state
	lexerState->disableMacroArgs = true;
	lexerState->disableInterpolation = true;

	for (;;) {
		if (atLineStart) {
			int c;

			for (;; shiftChar()) {
				c = peek();
				if (!isWhitespace(c))
					break;
			}

			if (startsIdentifier(c)) {
				shiftChar();
				token = readIdentifier(c);
				switch (token) {
				case T_POP_IF:
					lexer_IncIFDepth();
					break;

				case T_POP_ELIF:
					if (lexer_ReachedELSEBlock())
						fatalerror("Found ELIF after an ELSE block\n");
					goto maybeFinish;

				case T_POP_ELSE:
					if (lexer_ReachedELSEBlock())
						fatalerror("Found ELSE after an ELSE block\n");
					lexer_ReachELSEBlock();
					// fallthrough
				maybeFinish:
					if (toEndc) // Ignore ELIF and ELSE, go to ENDC
						break;
					// fallthrough
				case T_POP_ENDC:
					if (lexer_GetIFDepth() == startingDepth)
						goto finish;
					if (token == T_POP_ENDC)
						lexer_DecIFDepth();
				}
			}
			atLineStart = false;
		}

		// Read chars until EOL
		do {
			int c = nextChar();

			if (c == EOF) {
				token = T_EOF;
				goto finish;
			} else if (c == '\\') {
				// Unconditionally skip the next char, including line conts
				c = nextChar();
			} else if (c == '\r' || c == '\n') {
				atLineStart = true;
			}

			if (c == '\r' || c == '\n') {
				// Handle CRLF before nextLine() since shiftChar updates colNo
				handleCRLF(c);
				// Do this both on line continuations and plain EOLs
				nextLine();
			}
		} while (!atLineStart);
	}

finish:
	lexerState->disableMacroArgs = false;
	lexerState->disableInterpolation = false;
	lexerState->atLineStart = false;

	return token;
}